

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-kalman-filter-template.cpp
# Opt level: O1

double testExtendedKalmanFilterLTV(void)

{
  double dVar1;
  undefined1 *puVar2;
  evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_> eVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  uint i_5;
  int iVar7;
  int iVar8;
  double *pdVar9;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
  *y_k;
  Index i_1;
  long lVar10;
  Matrix<double,_4,_4,_0,_4,_4> *pMVar11;
  iterator iVar12;
  iterator iVar13;
  uint k;
  InputVector *u_k;
  uint i;
  Index i_2;
  unit_normal_distribution<double> *this;
  uint i_3;
  long lVar14;
  byte bVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  Rmatrix r1;
  Pmatrix p;
  StateVector xh;
  StateVector x;
  StateVector v;
  Qmatrix q1;
  MeasureVector w;
  KalmanFunctorLTV func;
  Rmatrix r;
  Qmatrix q;
  StateVector dx;
  ekf f;
  InputVector uk [1001];
  MeasureVector yk [1000];
  lagged_fibonacci1279 gen_;
  StateVector xk [1001];
  double adStack_12ae8 [3];
  undefined1 *puStack_12ad0;
  double dStack_12ac8;
  double dStack_12ac0;
  double adStack_12ab8 [3];
  undefined1 *puStack_12aa0;
  double dStack_12a98;
  double dStack_12a90;
  double adStack_12a88 [4];
  double adStack_12a68 [17];
  double dStack_129e0;
  double dStack_129d8;
  double dStack_129d0;
  double dStack_129c8;
  double dStack_129c0;
  double dStack_129b0;
  double dStack_129a8;
  double dStack_129a0;
  StateVector SStack_12998;
  undefined1 auStack_12978 [16];
  undefined1 auStack_12968 [16];
  undefined1 auStack_12958 [24];
  double adStack_12940 [29];
  Cmatrix CStack_12858;
  DynamicsFunctorBase DStack_127f8;
  void *pvStack_127f0;
  iterator iStack_127e8;
  Matrix<double,_4,_4,_0,_4,_4> *pMStack_127e0;
  void *pvStack_127d8;
  iterator iStack_127d0;
  Matrix<double,_3,_4,_0,_3,_4> *pMStack_127c8;
  double dStack_127b8;
  double dStack_127b0;
  double dStack_127a8;
  double dStack_127a0;
  double dStack_12798;
  double dStack_12790;
  double dStack_12788;
  double dStack_12778;
  double dStack_12770;
  double dStack_12768;
  double dStack_12760;
  double dStack_12758;
  double dStack_12750;
  double dStack_12748;
  double dStack_12740;
  double dStack_12738;
  double dStack_12730;
  double dStack_12728;
  double dStack_12720;
  double dStack_12718;
  double dStack_12710;
  StateVector SStack_12708;
  double dStack_126e8;
  double dStack_126e0;
  double dStack_126d8;
  double dStack_126d0;
  double dStack_126c8;
  double dStack_126c0;
  double dStack_126b8;
  double dStack_126b0;
  double dStack_126a8;
  double adStack_12698 [16];
  StateVector SStack_12618;
  ExtendedKalmanFilter<4U,_3U,_1U> EStack_125f8;
  DenseStorage<double,_1,_1,_1,_0> DStack_12268;
  InputVector aIStack_12260 [1001];
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
  agStack_10318 [750];
  lagged_fibonacci_01_engine<double,_48,_1279U,_418U> local_a558;
  Matrix<double,_4,_4,_0,_4,_4> local_7d58 [250];
  double local_58;
  double dStack_50;
  double local_48;
  double dStack_40;
  
  bVar15 = 0;
  puStack_12ad0 = (undefined1 *)0x10bac0;
  stateObservation::compileTime::ExtendedKalmanFilter<4U,_3U,_1U>::ExtendedKalmanFilter
            (&EStack_125f8,true);
  DStack_127f8._vptr_DynamicsFunctorBase =
       (_func_int **)&PTR_Matrix<double,1,1,0,1,1>_const__unsigned_int__001223c8;
  pvStack_127f0 = (void *)0x0;
  iStack_127e8._M_current = (Matrix<double,_4,_4,_0,_4,_4> *)0x0;
  pMStack_127e0 = (Matrix<double,_4,_4,_0,_4,_4> *)0x0;
  pvStack_127d8 = (void *)0x0;
  iStack_127d0._M_current = (Matrix<double,_3,_4,_0,_3,_4> *)0x0;
  pMStack_127c8 = (Matrix<double,_3,_4,_0,_3,_4> *)0x0;
  puStack_12ad0 = (undefined1 *)0x10baef;
  iVar7 = rand();
  dStack_127b8 = ((double)iVar7 + (double)iVar7) / 2147483647.0 + -1.0;
  puStack_12ad0 = (undefined1 *)0x10bb14;
  iVar7 = rand();
  dStack_127b0 = ((double)iVar7 + (double)iVar7) / 2147483647.0 + -1.0;
  puStack_12ad0 = (undefined1 *)0x10bb39;
  iVar7 = rand();
  dStack_127a8 = ((double)iVar7 + (double)iVar7) / 2147483647.0 + -1.0;
  puStack_12ad0 = (undefined1 *)0x10bb5e;
  iVar7 = rand();
  dStack_127a0 = ((double)iVar7 + (double)iVar7) / 2147483647.0 + -1.0;
  puStack_12ad0 = (undefined1 *)0x10bb83;
  iVar7 = rand();
  dStack_12798 = ((double)iVar7 + (double)iVar7) / 2147483647.0 + -1.0;
  puStack_12ad0 = (undefined1 *)0x10bba8;
  iVar7 = rand();
  dStack_12790 = ((double)iVar7 + (double)iVar7) / 2147483647.0 + -1.0;
  puStack_12ad0 = (undefined1 *)0x10bbcd;
  iVar7 = rand();
  dStack_12788 = ((double)iVar7 + (double)iVar7) / 2147483647.0 + -1.0;
  iVar7 = 0;
  do {
    lVar10 = 0;
    do {
      puStack_12ad0 = (undefined1 *)0x10bc17;
      iVar8 = rand();
      local_7d58[0].super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
      array[lVar10] = (((double)iVar8 + (double)iVar8) / 2147483647.0 + -1.0) * 0.5;
      lVar10 = lVar10 + 1;
    } while (lVar10 != 0x10);
    if (iStack_127e8._M_current == pMStack_127e0) {
      puStack_12ad0 = (undefined1 *)0x10bc87;
      std::
      vector<Eigen::Matrix<double,4,4,0,4,4>,Eigen::aligned_allocator<Eigen::Matrix<double,4,4,0,4,4>>>
      ::_M_realloc_insert<Eigen::Matrix<double,4,4,0,4,4>>
                ((vector<Eigen::Matrix<double,4,4,0,4,4>,Eigen::aligned_allocator<Eigen::Matrix<double,4,4,0,4,4>>>
                  *)&pvStack_127f0,iStack_127e8,local_7d58);
    }
    else {
      pMVar11 = local_7d58;
      iVar12._M_current = iStack_127e8._M_current;
      for (lVar10 = 0x10; lVar10 != 0; lVar10 = lVar10 + -1) {
        ((iVar12._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).
        m_storage.m_data.array[0] =
             (pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
             m_data.array[0];
        pMVar11 = (Matrix<double,_4,_4,_0,_4,_4> *)((long)pMVar11 + ((ulong)bVar15 * -2 + 1) * 8);
        iVar12._M_current =
             (Matrix<double,_4,_4,_0,_4,_4> *)
             ((long)iVar12._M_current + ((ulong)bVar15 * -2 + 1) * 8);
      }
      iStack_127e8._M_current = iStack_127e8._M_current + 1;
    }
    agStack_10318[0].m_dst = (DstEvaluatorType *)&local_a558;
    puStack_12ad0 = (undefined1 *)0x10bcbc;
    agStack_10318[0].m_src = (SrcEvaluatorType *)&DStack_12268;
    agStack_10318[0].m_functor = (assign_op<double,_double> *)auStack_12958;
    agStack_10318[0].m_dstExpr = (DstXprType *)local_7d58;
    local_a558._0_8_ = local_7d58;
    iVar8 = rand();
    local_7d58[0].super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
    array[0] = ((double)iVar8 + (double)iVar8) / 2147483647.0 + -1.0;
    eVar3.m_d.data =
         ((agStack_10318[0].m_dst)->
         super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>).m_d;
    puStack_12ad0 = (undefined1 *)0x10bcf8;
    iVar8 = rand();
    *(double *)((long)eVar3.m_d.data + 8) = ((double)iVar8 + (double)iVar8) / 2147483647.0 + -1.0;
    eVar3.m_d.data =
         ((agStack_10318[0].m_dst)->
         super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>).m_d;
    puStack_12ad0 = (undefined1 *)0x10bd28;
    iVar8 = rand();
    *(double *)((long)eVar3.m_d.data + 0x10) = ((double)iVar8 + (double)iVar8) / 2147483647.0 + -1.0
    ;
    puStack_12ad0 = (undefined1 *)0x10bd50;
    Eigen::internal::
    copy_using_evaluator_LinearTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_3,_12>
    ::run(agStack_10318);
    if (iStack_127d0._M_current == pMStack_127c8) {
      puStack_12ad0 = (undefined1 *)0x10bd8b;
      std::
      vector<Eigen::Matrix<double,3,4,0,3,4>,Eigen::aligned_allocator<Eigen::Matrix<double,3,4,0,3,4>>>
      ::_M_realloc_insert<Eigen::Matrix<double,3,4,0,3,4>>
                ((vector<Eigen::Matrix<double,3,4,0,3,4>,Eigen::aligned_allocator<Eigen::Matrix<double,3,4,0,3,4>>>
                  *)&pvStack_127d8,iStack_127d0,(Matrix<double,_3,_4,_0,_3,_4> *)local_7d58);
    }
    else {
      pMVar11 = local_7d58;
      iVar13._M_current = iStack_127d0._M_current;
      for (lVar10 = 0xc; lVar10 != 0; lVar10 = lVar10 + -1) {
        ((iVar13._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
        m_storage.m_data.array[0] =
             (pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
             m_data.array[0];
        pMVar11 = (Matrix<double,_4,_4,_0,_4,_4> *)((long)pMVar11 + ((ulong)bVar15 * -2 + 1) * 8);
        iVar13._M_current =
             (Matrix<double,_3,_4,_0,_3,_4> *)
             ((long)iVar13._M_current + ((ulong)bVar15 * -2 + 1) * 8);
      }
      iStack_127d0._M_current = iStack_127d0._M_current + 1;
    }
    iVar7 = iVar7 + 1;
  } while (iVar7 != 0x3e9);
  EStack_125f8.f_ = &DStack_127f8;
  auStack_12968 = ZEXT816(0);
  auStack_12978 = ZEXT816(0);
  puStack_12ad0 = (undefined1 *)0x10bdd5;
  boost::random::lagged_fibonacci_01_engine<double,_48,_1279U,_418U>::seed
            (&local_a558,
             &boost::random::lagged_fibonacci_01_engine<double,48,1279u,418u>::default_seed);
  puStack_12ad0 = (undefined1 *)0x10bdda;
  iVar7 = rand();
  adStack_12ab8[0] = (((double)iVar7 + (double)iVar7) / 2147483647.0 + -1.0) * 0.01;
  puStack_12ad0 = (undefined1 *)0x10be10;
  iVar7 = rand();
  adStack_12ab8[1] = (((double)iVar7 + (double)iVar7) / 2147483647.0 + -1.0) * 0.01;
  puStack_12ad0 = (undefined1 *)0x10be3e;
  iVar7 = rand();
  adStack_12ab8[2] = (((double)iVar7 + (double)iVar7) / 2147483647.0 + -1.0) * 0.01;
  puStack_12ad0 = (undefined1 *)0x10be6c;
  iVar7 = rand();
  puStack_12aa0 = (undefined1 *)((((double)iVar7 + (double)iVar7) / 2147483647.0 + -1.0) * 0.01);
  puStack_12ad0 = (undefined1 *)0x10be9a;
  iVar7 = rand();
  dStack_12a98 = (((double)iVar7 + (double)iVar7) / 2147483647.0 + -1.0) * 0.01;
  puStack_12ad0 = (undefined1 *)0x10bec8;
  iVar7 = rand();
  dStack_12a90 = (((double)iVar7 + (double)iVar7) / 2147483647.0 + -1.0) * 0.01;
  puStack_12ad0 = (undefined1 *)0x10bef6;
  iVar7 = rand();
  adStack_12a88[0] = (((double)iVar7 + (double)iVar7) / 2147483647.0 + -1.0) * 0.01;
  puStack_12ad0 = (undefined1 *)0x10bf24;
  iVar7 = rand();
  adStack_12a88[1] = (((double)iVar7 + (double)iVar7) / 2147483647.0 + -1.0) * 0.01;
  puStack_12ad0 = (undefined1 *)0x10bf52;
  iVar7 = rand();
  adStack_12a88[2] = (((double)iVar7 + (double)iVar7) / 2147483647.0 + -1.0) * 0.01;
  lVar10 = 0;
  do {
    puStack_12ad0 = (undefined1 *)0x10bf83;
    iVar7 = rand();
    adStack_12940[lVar10 + 0xd] = (((double)iVar7 + (double)iVar7) / 2147483647.0 + -1.0) * 0.01;
    lVar10 = lVar10 + 1;
  } while (lVar10 != 0x10);
  lVar10 = 6;
  pdVar9 = &dStack_126d8;
  do {
    dVar1 = adStack_12ae8[lVar10];
    puVar2 = (&puStack_12ad0)[lVar10];
    dVar21 = adStack_12ab8[lVar10];
    pdVar9[-2] = dVar21 * adStack_12a88[0] +
                 (double)puVar2 * (double)puStack_12aa0 + dVar1 * adStack_12ab8[0];
    pdVar9[-1] = dVar21 * adStack_12a88[1] +
                 (double)puVar2 * dStack_12a98 + dVar1 * adStack_12ab8[1];
    *pdVar9 = adStack_12ab8[lVar10] * adStack_12a88[2] +
              (double)(&puStack_12ad0)[lVar10] * dStack_12a90 + dVar1 * adStack_12ab8[2];
    lVar10 = lVar10 + 1;
    pdVar9 = pdVar9 + 3;
  } while (lVar10 != 9);
  lVar10 = 0;
  do {
    dVar1 = *(double *)((long)adStack_12940 + lVar10 + 0x68);
    dVar21 = *(double *)((long)adStack_12940 + lVar10 + 0x88);
    dVar23 = *(double *)((long)adStack_12940 + lVar10 + 0xa8);
    dVar20 = *(double *)((long)adStack_12940 + lVar10 + 200);
    *(double *)((long)adStack_12698 + lVar10 * 4) =
         adStack_12940[0x19] * dVar20 +
         adStack_12940[0x15] * dVar23 + adStack_12940[0x11] * dVar21 + adStack_12940[0xd] * dVar1;
    *(double *)((long)adStack_12698 + lVar10 * 4 + 8) =
         adStack_12940[0x1a] * dVar20 +
         adStack_12940[0x16] * dVar23 + adStack_12940[0x12] * dVar21 + adStack_12940[0xe] * dVar1;
    *(double *)((long)adStack_12698 + lVar10 * 4 + 0x10) =
         dVar20 * adStack_12940[0x1b] +
         dVar23 * adStack_12940[0x17] + dVar21 * adStack_12940[0x13] + dVar1 * adStack_12940[0xf];
    *(double *)((long)adStack_12698 + lVar10 * 4 + 0x18) =
         dVar20 * adStack_12940[0x1c] +
         dVar23 * adStack_12940[0x18] + dVar21 * adStack_12940[0x14] + dVar1 * adStack_12940[0x10];
    lVar10 = lVar10 + 8;
  } while (lVar10 != 0x20);
  local_7d58[0].super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
  [0] = (double)auStack_12978._0_8_;
  local_7d58[0].super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
  [1] = (double)auStack_12978._8_8_;
  local_7d58[0].super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
  [2] = (double)auStack_12968._0_8_;
  local_7d58[0].super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
  [3] = (double)auStack_12968._8_8_;
  puStack_12ad0 = (undefined1 *)0x10c188;
  iVar7 = rand();
  DStack_12268.m_data.array[0] =
       (plain_array<double,_1,_0,_0>)(((double)iVar7 + (double)iVar7) / 2147483647.0 + -1.0);
  dStack_12ac8 = adStack_12940[0xd];
  dStack_12ac0 = adStack_12940[0xe];
  dStack_129c8 = adStack_12940[0xf];
  dStack_129c0 = adStack_12940[0x10];
  dStack_129d8 = adStack_12940[0x11];
  dStack_129d0 = adStack_12940[0x12];
  adStack_12a68[0x10] = adStack_12940[0x13];
  dStack_129e0 = adStack_12940[0x14];
  dStack_12718 = adStack_12940[0x15];
  dStack_12710 = adStack_12940[0x16];
  dStack_12728 = adStack_12940[0x19];
  dStack_12720 = adStack_12940[0x1a];
  dStack_12738 = adStack_12940[0x17];
  dStack_12730 = adStack_12940[0x18];
  dStack_12748 = adStack_12940[0x1b];
  dStack_12740 = adStack_12940[0x1c];
  dStack_12758 = adStack_12ab8[0];
  dStack_12750 = adStack_12ab8[1];
  dStack_12768 = (double)puStack_12aa0;
  dStack_12760 = dStack_12a98;
  dStack_12778 = adStack_12a88[0];
  dStack_12770 = adStack_12a88[1];
  dStack_129a0 = adStack_12ab8[2];
  dStack_129a8 = dStack_12a90;
  lVar10 = 1;
  dStack_129b0 = adStack_12a88[2];
  this = (unit_normal_distribution<double> *)adStack_12a68;
  do {
    lVar14 = 0;
    do {
      puStack_12ad0 = (undefined1 *)0x10c29d;
      dVar1 = boost::random::detail::unit_normal_distribution<double>::operator()(this,&local_a558);
      *(double *)(auStack_12958 + lVar14 * 8) = dVar1 + 0.0;
      lVar14 = lVar14 + 1;
    } while (lVar14 != 4);
    dVar1 = dStack_12ac0 * (double)auStack_12958._0_8_;
    dVar20 = dStack_12718 * (double)auStack_12958._16_8_;
    dVar22 = dStack_12710 * (double)auStack_12958._16_8_;
    dVar24 = dStack_12728 * adStack_12940[0];
    dVar25 = dStack_12720 * adStack_12940[0];
    dVar21 = adStack_12940[0] * dStack_12748;
    dVar23 = adStack_12940[0] * dStack_12740 +
             (double)auStack_12958._16_8_ * dStack_12730 +
             (double)auStack_12958._8_8_ * dStack_129e0 + (double)auStack_12958._0_8_ * dStack_129c0
    ;
    unique0x10001d98 = SUB84(dVar23,0);
    auStack_12958._16_8_ =
         dVar21 + (double)auStack_12958._16_8_ * dStack_12738 +
                  (double)auStack_12958._8_8_ * adStack_12a68[0x10] +
                  (double)auStack_12958._0_8_ * dStack_129c8;
    unique0x10001d9c = (int)((ulong)dVar23 >> 0x20);
    lVar14 = 0;
    auStack_12958._0_8_ =
         dVar24 + dVar20 + dStack_129d8 * (double)auStack_12958._8_8_ +
                           dStack_12ac8 * (double)auStack_12958._0_8_;
    auStack_12958._8_8_ = dVar25 + dVar22 + dStack_129d0 * (double)auStack_12958._8_8_ + dVar1;
    do {
      puStack_12ad0 = (undefined1 *)0x10c378;
      dVar1 = boost::random::detail::unit_normal_distribution<double>::operator()(this,&local_a558);
      CStack_12858.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
      array[lVar14] = dVar1 + 0.0;
      lVar14 = lVar14 + 1;
    } while (lVar14 != 3);
    dVar1 = CStack_12858.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
            m_data.array[0] * dStack_12750;
    dVar21 = CStack_12858.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
             m_data.array[2] * dStack_12778;
    dVar23 = CStack_12858.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
             m_data.array[2] * dStack_12770;
    CStack_12858.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array
    [2] = CStack_12858.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data
          .array[2] * dStack_129b0 +
          CStack_12858.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data
          .array[1] * dStack_129a8 +
          CStack_12858.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data
          .array[0] * dStack_129a0;
    puStack_12ad0 = (undefined1 *)0x10c42e;
    CStack_12858.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array
    [0] = dVar21 + CStack_12858.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.
                   m_storage.m_data.array[1] * dStack_12768 +
                   CStack_12858.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.
                   m_storage.m_data.array[0] * dStack_12758;
    CStack_12858.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array
    [1] = dVar23 + CStack_12858.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.
                   m_storage.m_data.array[1] * dStack_12760 + dVar1;
    iVar7 = rand();
    aIStack_12260[lVar10 + -1].super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.
    m_storage.m_data.array[0] = ((double)iVar7 + (double)iVar7) / 2147483647.0 + -1.0;
    lVar14 = lVar10 + -1;
    puStack_12ad0 = (undefined1 *)0x10c479;
    testExtendedKalmanFilterLTV()::KalmanFunctorLTV::stateDynamics(Eigen::
    Matrix<double,4,1,0,4,1>const&,Eigen::Matrix<double,1,1,0,1,1>_const__unsigned_int_
              ((StateVector *)this,&DStack_127f8,(StateVector *)auStack_12978,
               (InputVector *)((long)&EStack_125f8 + lVar10 * 8 + 0x388),(uint)lVar14);
    uVar16 = SUB84(adStack_12a68[1] + (double)auStack_12958._8_8_,0);
    uVar17 = (undefined4)((ulong)(adStack_12a68[1] + (double)auStack_12958._8_8_) >> 0x20);
    auStack_12978._8_4_ = uVar16;
    auStack_12978._0_8_ = adStack_12a68[0] + (double)auStack_12958._0_8_;
    auStack_12978._12_4_ = uVar17;
    uVar18 = SUB84(adStack_12a68[3] + adStack_12940[0],0);
    uVar19 = (undefined4)((ulong)(adStack_12a68[3] + adStack_12940[0]) >> 0x20);
    auStack_12968._8_4_ = uVar18;
    auStack_12968._0_8_ = adStack_12a68[2] + (double)auStack_12958._16_8_;
    auStack_12968._12_4_ = uVar19;
    auVar4._8_4_ = uVar16;
    auVar4._0_8_ = adStack_12a68[0] + (double)auStack_12958._0_8_;
    auVar4._12_4_ = uVar17;
    *(undefined1 (*) [16])
     (local_7d58[0].super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
      array + lVar10 * 4) = auVar4;
    auVar6._8_4_ = uVar18;
    auVar6._0_8_ = adStack_12a68[2] + (double)auStack_12958._16_8_;
    auVar6._12_4_ = uVar19;
    *(undefined1 (*) [16])
     ((long)local_7d58[0].super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
            m_data.array + lVar10 * 0x20 + 0x10) = auVar6;
    y_k = agStack_10318;
    puStack_12ad0 = (undefined1 *)0x10c4e3;
    testExtendedKalmanFilterLTV()::KalmanFunctorLTV::measureDynamics(Eigen::
    Matrix<double,4,1,0,4,1>const&,Eigen::Matrix<double,1,1,0,1,1>_const__unsigned_int_
              ((MeasureVector *)this,&DStack_127f8,(StateVector *)auStack_12978,
               aIStack_12260 + lVar10 + -1,(uint)lVar10);
    auVar5._8_4_ = SUB84(adStack_12a68[1] +
                         CStack_12858.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.
                         m_storage.m_data.array[1],0);
    auVar5._0_8_ = adStack_12a68[0] +
                   CStack_12858.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.
                   m_storage.m_data.array[0];
    auVar5._12_4_ =
         (int)((ulong)(adStack_12a68[1] +
                      CStack_12858.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.
                      m_storage.m_data.array[1]) >> 0x20);
    *(undefined1 (*) [16])((long)agStack_10318 + lVar14 * 0x18) = auVar5;
    *(double *)((long)agStack_10318 + lVar14 * 0x18 + 0x10) =
         adStack_12a68[2] +
         CStack_12858.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
         array[2];
    lVar10 = lVar10 + 1;
  } while (lVar10 != 0x3e9);
  puStack_12ad0 = (undefined1 *)0x10c533;
  iVar7 = rand();
  SStack_12998.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
  [0] = ((double)iVar7 + (double)iVar7) / 2147483647.0 + -1.0;
  puStack_12ad0 = (undefined1 *)0x10c568;
  iVar7 = rand();
  SStack_12998.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
  [1] = ((double)iVar7 + (double)iVar7) / 2147483647.0 + -1.0;
  puStack_12ad0 = (undefined1 *)0x10c58e;
  iVar7 = rand();
  SStack_12998.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
  [2] = ((double)iVar7 + (double)iVar7) / 2147483647.0 + -1.0;
  puStack_12ad0 = (undefined1 *)0x10c5b4;
  iVar7 = rand();
  SStack_12998.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
  [3] = ((double)iVar7 + (double)iVar7) / 2147483647.0 + -1.0;
  puStack_12ad0 = (undefined1 *)0x10c5e7;
  stateObservation::compileTime::ZeroDelayObserver<4U,_3U,_1U>::setState
            ((ZeroDelayObserver<4U,_3U,_1U> *)&EStack_125f8,&SStack_12998,0);
  adStack_12a68[0xe] = 0.0;
  adStack_12a68[0xf] = 0.0;
  adStack_12a68[0xc] = 0.0;
  adStack_12a68[0xd] = 0.0;
  adStack_12a68[10] = 0.0;
  adStack_12a68[0xb] = 0.0;
  adStack_12a68[8] = 0.0;
  adStack_12a68[9] = 0.0;
  adStack_12a68[6] = 0.0;
  adStack_12a68[7] = 0.0;
  adStack_12a68[4] = 0.0;
  adStack_12a68[5] = 0.0;
  adStack_12a68[2] = 0.0;
  adStack_12a68[3] = 0.0;
  adStack_12a68[0] = 0.0;
  adStack_12a68[1] = 0.0;
  if (EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.super_ZeroDelayObserver<4U,_3U,_1U>.x_.isSet_
      != false) {
    EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.p_.k_ =
         EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.super_ZeroDelayObserver<4U,_3U,_1U>.x_.k_;
    EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.p_.v_.
    super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0] = 0.0;
    EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.p_.v_.
    super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[1] = 0.0;
    EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.p_.v_.
    super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[2] = 0.0;
    EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.p_.v_.
    super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[3] = 0.0;
    EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.p_.v_.
    super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[4] = 0.0;
    EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.p_.v_.
    super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[5] = 0.0;
    EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.p_.v_.
    super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[6] = 0.0;
    EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.p_.v_.
    super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[7] = 0.0;
    EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.p_.v_.
    super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[8] = 0.0;
    EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.p_.v_.
    super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[9] = 0.0;
    EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.p_.v_.
    super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[10] = 0.0;
    EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.p_.v_.
    super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xb] = 0.0;
    EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.p_.v_.
    super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xc] = 0.0;
    EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.p_.v_.
    super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xd] = 0.0;
    EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.p_.v_.
    super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xe] = 0.0;
    EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.p_.v_.
    super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xf] = 0.0;
    EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.p_.isSet_ = true;
    EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.r_.k_ = 0;
    EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.r_.v_.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
         dStack_126e8;
    EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.r_.v_.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] =
         dStack_126e0;
    EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.r_.v_.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
         dStack_126d8;
    EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.r_.v_.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] =
         dStack_126d0;
    EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.r_.v_.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] =
         dStack_126c8;
    EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.r_.v_.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] =
         dStack_126c0;
    EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.r_.v_.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] =
         dStack_126b8;
    EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.r_.v_.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] =
         dStack_126b0;
    EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.r_.v_.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] =
         dStack_126a8;
    EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.r_.isSet_ = true;
    EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.q_.k_ = 0;
    EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.q_.v_.
    super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0] =
         adStack_12698[0];
    EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.q_.v_.
    super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[1] =
         adStack_12698[1];
    EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.q_.v_.
    super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[2] =
         adStack_12698[2];
    EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.q_.v_.
    super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[3] =
         adStack_12698[3];
    EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.q_.v_.
    super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[4] =
         adStack_12698[4];
    EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.q_.v_.
    super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[5] =
         adStack_12698[5];
    EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.q_.v_.
    super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[6] =
         adStack_12698[6];
    EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.q_.v_.
    super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[7] =
         adStack_12698[7];
    EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.q_.v_.
    super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[8] =
         adStack_12698[8];
    EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.q_.v_.
    super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[9] =
         adStack_12698[9];
    EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.q_.v_.
    super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[10] =
         adStack_12698[10];
    EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.q_.v_.
    super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xb] =
         adStack_12698[0xb];
    EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.q_.v_.
    super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xc] =
         adStack_12698[0xc];
    EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.q_.v_.
    super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xd] =
         adStack_12698[0xd];
    EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.q_.v_.
    super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xe] =
         adStack_12698[0xe];
    EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.q_.v_.
    super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xf] =
         adStack_12698[0xf];
    EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.q_.isSet_ = true;
    puStack_12ad0 = (undefined1 *)0x10c7bc;
    stateObservation::compileTime::ZeroDelayObserver<4U,_3U,_1U>::setInput
              ((ZeroDelayObserver<4U,_3U,_1U> *)&EStack_125f8,(InputVector *)&DStack_12268,0);
    lVar10 = 0;
    do {
      *(double *)this =
           SStack_12998.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
           m_data.array[lVar10];
      lVar10 = lVar10 + 1;
      this = this + 0x28;
    } while (lVar10 != 4);
    lVar10 = 0;
    do {
      dVar1 = *(double *)((long)adStack_12a68 + lVar10);
      dVar21 = *(double *)((long)adStack_12a68 + lVar10 + 0x20);
      dVar23 = *(double *)((long)adStack_12a68 + lVar10 + 0x40);
      dVar20 = *(double *)((long)adStack_12a68 + lVar10 + 0x60);
      *(double *)(auStack_12958 + lVar10 * 4) =
           adStack_12a68[0xc] * dVar20 +
           adStack_12a68[8] * dVar23 + adStack_12a68[4] * dVar21 + adStack_12a68[0] * dVar1;
      *(double *)(auStack_12958 + lVar10 * 4 + 8) =
           adStack_12a68[0xd] * dVar20 +
           adStack_12a68[9] * dVar23 + adStack_12a68[5] * dVar21 + adStack_12a68[1] * dVar1;
      *(double *)((long)adStack_12940 + lVar10 * 4 + -8) =
           dVar20 * adStack_12a68[0xe] +
           dVar23 * adStack_12a68[10] + dVar21 * adStack_12a68[6] + dVar1 * adStack_12a68[2];
      *(double *)((long)adStack_12940 + lVar10 * 4) =
           dVar20 * adStack_12a68[0xf] +
           dVar23 * adStack_12a68[0xb] + dVar21 * adStack_12a68[7] + dVar1 * adStack_12a68[3];
      lVar10 = lVar10 + 8;
    } while (lVar10 != 0x20);
    adStack_12a68[0] = (double)auStack_12958._0_8_;
    adStack_12a68[1] = (double)auStack_12958._8_8_;
    adStack_12a68[2] = (double)auStack_12958._16_8_;
    adStack_12a68[3] = adStack_12940[0];
    adStack_12a68[4] = adStack_12940[1];
    adStack_12a68[5] = adStack_12940[2];
    adStack_12a68[6] = adStack_12940[3];
    adStack_12a68[7] = adStack_12940[4];
    adStack_12a68[8] = adStack_12940[5];
    adStack_12a68[9] = adStack_12940[6];
    adStack_12a68[10] = adStack_12940[7];
    adStack_12a68[0xb] = adStack_12940[8];
    adStack_12a68[0xc] = adStack_12940[9];
    adStack_12a68[0xd] = adStack_12940[10];
    adStack_12a68[0xe] = adStack_12940[0xb];
    adStack_12a68[0xf] = adStack_12940[0xc];
    SStack_12618.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
    [0] = 1e-08;
    SStack_12618.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
    [1] = 1e-08;
    SStack_12618.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
    [2] = 1e-08;
    SStack_12618.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
    [3] = 1e-08;
    lVar10 = -1000;
    u_k = aIStack_12260;
    do {
      iVar7 = (int)lVar10;
      puStack_12ad0 = (undefined1 *)0x10c97d;
      stateObservation::compileTime::ZeroDelayObserver<4U,_3U,_1U>::setMeasurement
                ((ZeroDelayObserver<4U,_3U,_1U> *)&EStack_125f8,(MeasureVector *)y_k,iVar7 + 0x3e9);
      puStack_12ad0 = (undefined1 *)0x10c98e;
      stateObservation::compileTime::ZeroDelayObserver<4U,_3U,_1U>::setInput
                ((ZeroDelayObserver<4U,_3U,_1U> *)&EStack_125f8,u_k,iVar7 + 0x3e9);
      puStack_12ad0 = (undefined1 *)0x10c9a9;
      stateObservation::compileTime::ExtendedKalmanFilter<4U,_3U,_1U>::getAMatrixFD
                ((Amatrix *)auStack_12958,&EStack_125f8,&SStack_12618);
      puStack_12ad0 = (undefined1 *)0x10c9bc;
      stateObservation::compileTime::ExtendedKalmanFilter<4U,_3U,_1U>::getCMatrixFD
                (&CStack_12858,&EStack_125f8,&SStack_12618);
      EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.a_.k_ = 0;
      EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.a_.v_.
      super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0] =
           (double)auStack_12958._0_8_;
      EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.a_.v_.
      super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[1] =
           (double)auStack_12958._8_8_;
      EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.a_.v_.
      super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[2] =
           (double)auStack_12958._16_8_;
      EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.a_.v_.
      super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[3] =
           adStack_12940[0];
      EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.a_.v_.
      super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[4] =
           adStack_12940[1];
      EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.a_.v_.
      super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[5] =
           adStack_12940[2];
      EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.a_.v_.
      super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[6] =
           adStack_12940[3];
      EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.a_.v_.
      super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[7] =
           adStack_12940[4];
      EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.a_.v_.
      super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[8] =
           adStack_12940[5];
      EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.a_.v_.
      super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[9] =
           adStack_12940[6];
      EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.a_.v_.
      super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[10] =
           adStack_12940[7];
      EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.a_.v_.
      super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xb] =
           adStack_12940[8];
      EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.a_.v_.
      super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xc] =
           adStack_12940[9];
      EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.a_.v_.
      super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xd] =
           adStack_12940[10];
      EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.a_.v_.
      super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xe] =
           adStack_12940[0xb];
      EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.a_.v_.
      super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xf] =
           adStack_12940[0xc];
      EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.a_.isSet_ = true;
      EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.c_.k_ = 0;
      EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.c_.v_.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[0] =
           CStack_12858.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
           m_data.array[0];
      EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.c_.v_.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[1] =
           CStack_12858.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
           m_data.array[1];
      EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.c_.v_.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[2] =
           CStack_12858.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
           m_data.array[2];
      EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.c_.v_.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[3] =
           CStack_12858.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
           m_data.array[3];
      EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.c_.v_.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[4] =
           CStack_12858.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
           m_data.array[4];
      EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.c_.v_.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[5] =
           CStack_12858.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
           m_data.array[5];
      EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.c_.v_.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[6] =
           CStack_12858.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
           m_data.array[6];
      EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.c_.v_.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[7] =
           CStack_12858.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
           m_data.array[7];
      EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.c_.v_.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[8] =
           CStack_12858.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
           m_data.array[8];
      EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.c_.v_.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[9] =
           CStack_12858.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
           m_data.array[9];
      EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.c_.v_.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[10] =
           CStack_12858.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
           m_data.array[10];
      EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.c_.v_.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[0xb] =
           CStack_12858.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.
           m_data.array[0xb];
      EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.c_.isSet_ = true;
      puStack_12ad0 = (undefined1 *)0x10cada;
      stateObservation::compileTime::ZeroDelayObserver<4U,_3U,_1U>::getEstimatedState
                (&SStack_12708,(ZeroDelayObserver<4U,_3U,_1U> *)&EStack_125f8,iVar7 + 0x3e9);
      SStack_12998.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
      array[0] = SStack_12708.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
                 .m_data.array[0];
      SStack_12998.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
      array[1] = SStack_12708.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
                 .m_data.array[1];
      SStack_12998.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
      array[2] = SStack_12708.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
                 .m_data.array[2];
      SStack_12998.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
      array[3] = SStack_12708.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
                 .m_data.array[3];
      u_k = u_k + 1;
      y_k = (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
             *)&y_k->m_dstExpr;
      lVar10 = lVar10 + 1;
    } while (lVar10 != 0);
    dStack_129c8 = SStack_12708.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                   m_storage.m_data.array[0];
    dStack_129c0 = SStack_12708.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                   m_storage.m_data.array[1];
    dStack_12ac8 = SStack_12708.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                   m_storage.m_data.array[2];
    dStack_12ac0 = SStack_12708.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                   m_storage.m_data.array[3];
    adStack_12a68[0x10] = local_58;
    dStack_129e0 = dStack_50;
    dStack_129d8 = local_48;
    dStack_129d0 = dStack_40;
    DStack_127f8._vptr_DynamicsFunctorBase =
         (_func_int **)&PTR_Matrix<double,1,1,0,1,1>_const__unsigned_int__001223c8;
    if (pvStack_127d8 != (void *)0x0) {
      puStack_12ad0 = (undefined1 *)0x10cb6c;
      free(pvStack_127d8);
    }
    if (pvStack_127f0 != (void *)0x0) {
      puStack_12ad0 = (undefined1 *)0x10cb7e;
      free(pvStack_127f0);
    }
    dStack_12ac8 = SQRT((dStack_12ac0 - dStack_129d0) * (dStack_12ac0 - dStack_129d0) +
                        (dStack_129c0 - dStack_129e0) * (dStack_129c0 - dStack_129e0) +
                        (dStack_12ac8 - dStack_129d8) * (dStack_12ac8 - dStack_129d8) +
                        (dStack_129c8 - adStack_12a68[0x10]) * (dStack_129c8 - adStack_12a68[0x10]))
    ;
    EStack_125f8.super_KalmanFilterBase<4U,_3U,_1U>.super_ZeroDelayObserver<4U,_3U,_1U>.
    super_ObserverBase<4U,_3U,_1U>._vptr_ObserverBase =
         (_func_int **)&PTR__ZeroDelayObserver_00122458;
    puStack_12ad0 = (undefined1 *)0x10cbda;
    std::
    _Deque_base<stateObservation::compileTime::IndexedMatrix<1U,_1U>,_Eigen::aligned_allocator<stateObservation::compileTime::IndexedMatrix<1U,_1U>_>_>
    ::~_Deque_base((_Deque_base<stateObservation::compileTime::IndexedMatrix<1U,_1U>,_Eigen::aligned_allocator<stateObservation::compileTime::IndexedMatrix<1U,_1U>_>_>
                    *)((long)&EStack_125f8 + 0x90));
    puStack_12ad0 = (undefined1 *)0x10cbe7;
    std::
    _Deque_base<stateObservation::compileTime::IndexedMatrix<3U,_1U>,_Eigen::aligned_allocator<stateObservation::compileTime::IndexedMatrix<3U,_1U>_>_>
    ::~_Deque_base((_Deque_base<stateObservation::compileTime::IndexedMatrix<3U,_1U>,_Eigen::aligned_allocator<stateObservation::compileTime::IndexedMatrix<3U,_1U>_>_>
                    *)((long)&EStack_125f8 + 0x40));
    return dStack_12ac8;
  }
  puStack_12ad0 = &LAB_0010cc1d;
  __assert_fail("isSet_ && \"Error : Matrix not initialized\"",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/stack-of-tasks[P]state-observation/include/state-observation/observer/compile-time/compile-time-observer-base.hxx"
                ,0x3e,
                "void stateObservation::compileTime::IndexedMatrix<4, 1>::check_() const [r = 4, c = 1]"
               );
}

Assistant:

double testExtendedKalmanFilterLTV()
{
    const static unsigned kmax=1000;

    typedef stateObservation::compileTime::ExtendedKalmanFilter<4,3,1> ekf;


    struct KalmanFunctorLTV:
                public ekf::DynamicsFunctorBase
    {

public:
        KalmanFunctorLTV()
        {
            s_=ekf::StateVector::Random();
            n_=ekf::MeasureVector::Random();

            for (unsigned i=0;i<=kmax;++i)
            {
                a.push_back( ekf::Amatrix::Random()*0.5 );
                c.push_back( ekf::Cmatrix::Random() );
            }

        }

        virtual ekf::StateVector stateDynamics(const ekf::StateVector& x, const ekf::InputVector& u, unsigned k)
        {
            ekf::StateVector xk1;
            unsigned kk=std::min(k,kmax);
            xk1=a[kk]*x+(u*u.transpose())[0]*s_;

            return xk1;
        }

        virtual ekf::MeasureVector measureDynamics(const ekf::StateVector& x, const ekf::InputVector &u,unsigned k)
        {
            (void)k;//unused
            (void)u;//unused

            ekf::MeasureVector yk;
            unsigned kk=std::min(k,kmax);
            yk=c[kk]*x+(u*u.transpose())[0]*n_;
            return yk;
        }

        std::vector<ekf::Amatrix,Eigen::aligned_allocator<ekf::Amatrix> > a;
        std::vector<ekf::Cmatrix,Eigen::aligned_allocator<ekf::Cmatrix> > c;
private:
        ekf::StateVector s_;
        ekf::MeasureVector n_;
    };


    ekf f;

    ekf::Amatrix a;
    KalmanFunctorLTV func;

    f.setFunctor(&func);



    ekf::StateVector xk[kmax+1];
    ekf::MeasureVector yk[kmax];
    ekf::InputVector uk[kmax+1];

    ekf::StateVector x=ekf::StateVector::Zero();



    boost::lagged_fibonacci1279 gen_;

    ekf::Rmatrix r1=ekf::Rmatrix::Random()*0.01;

    ekf::Qmatrix q1=ekf::Qmatrix::Random()*0.01;

    ekf::Rmatrix r(r1*r1.transpose());
    ekf::Qmatrix q(q1*q1.transpose());

    xk[0]=x;
    uk[0]=ekf::InputVector::Random();

    for (unsigned k=1; k<=kmax; ++k)
    {
        ekf::StateVector v;
        for (unsigned i=0;i<ekf::stateSize;++i)
        {
            boost::normal_distribution<> g(0, 1);
            v[i]=g(gen_);
        }
        v=q1*v;

        ekf::MeasureVector w;
        for (unsigned i=0;i<ekf::measureSize;++i)
        {
            boost::normal_distribution<> g(0, 1);
            w[i]=g(gen_);
        }
        w=r1*w;

        uk[k]=ekf::InputVector::Random();

        x=func.stateDynamics(x,uk[k-1],k-1)+v;

        xk[k]=x;
        yk[k-1]=func.measureDynamics(x,uk[k],k)+w;

    }

    ekf::StateVector xh=ekf::StateVector::Random();

    f.setState(xh,0);

    ekf::Pmatrix p=ekf::Pmatrix::Zero();



    f.setStateCovariance(p);

    f.setR(r);
    f.setQ(q);

    f.setInput(uk[0],0);

    for (unsigned i=0;i<ekf::stateSize;++i)
    {
        p(i,i)=xh[i];
    }
    p=p*p.transpose();

    ekf::StateVector dx=ekf::StateVector::Constant(1)*1e-8;

    unsigned i;
    for (i=1;i<=kmax;++i)
    {
        f.setMeasurement(yk[i-1],i);
        f.setInput(uk[i],i);


        ekf::Amatrix a=f.getAMatrixFD(dx);
        ekf::Cmatrix c= f.getCMatrixFD(dx);

        f.setA(a);
        f.setC(c);

        xh=f.getEstimatedState(i);
    }

    ekf::StateVector error(xh-xk[kmax]);

    return error.norm();

}